

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O0

bool __thiscall
wallet::anon_unknown_5::WalletImpl::getAddress
          (WalletImpl *this,CTxDestination *dest,string *name,isminetype *is_mine,
          AddressPurpose *purpose)

{
  AddressPurpose AVar1;
  isminetype *piVar2;
  optional<wallet::AddressPurpose> *this_00;
  isminetype *in_RCX;
  long in_RDX;
  CWallet *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  long in_FS_OFFSET;
  CAddressBookData **entry;
  optional<wallet::isminetype> dest_is_mine;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff18;
  isminetype *in_stack_ffffffffffffff20;
  undefined7 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2f;
  CAddressBookData *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  CWallet *this_01;
  uint in_stack_ffffffffffffff50;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *in_stack_ffffffffffffff58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  bool local_59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = (CWallet *)&in_RDI->vMasterKey;
  _GLOBAL__N_1::std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_ffffffffffffff18);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffff18);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (in_stack_ffffffffffffff58,
             (AnnotatedMixin<std::recursive_mutex> *)(ulong)in_stack_ffffffffffffff50,
             (char *)this_01,(char *)in_RDI,in_stack_ffffffffffffff3c,
             SUB41((uint)in_stack_ffffffffffffff38 >> 0x18,0));
  _GLOBAL__N_1::std::__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_ffffffffffffff18);
  local_50[0]._M_dataplus._M_p =
       (pointer)CWallet::FindAddressBookEntry
                          (in_RDI,(CTxDestination *)
                                  CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                           SUB81((ulong)in_stack_ffffffffffffff30 >> 0x38,0));
  __str = local_50;
  if ((CAddressBookData *)local_50[0]._M_dataplus._M_p == (CAddressBookData *)0x0) {
    local_59 = false;
  }
  else {
    if (in_RDX != 0) {
      CAddressBookData::GetLabel_abi_cxx11_(in_stack_ffffffffffffff30);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (in_R8,__str);
      std::__cxx11::string::~string(in_stack_ffffffffffffff18);
    }
    _GLOBAL__N_1::std::optional<wallet::isminetype>::optional
              ((optional<wallet::isminetype> *)in_stack_ffffffffffffff18);
    if ((in_RCX != (isminetype *)0x0) ||
       (in_R8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      _GLOBAL__N_1::std::
      __shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 in_stack_ffffffffffffff18);
      CWallet::IsMine(this_01,(CTxDestination *)in_RDI);
      _GLOBAL__N_1::std::optional<wallet::isminetype>::optional<wallet::isminetype,_true>
                ((optional<wallet::isminetype> *)
                 CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28),
                 in_stack_ffffffffffffff20);
      local_50[0].field_2._M_allocated_capacity = local_50[0]._M_string_length;
    }
    if (in_RCX != (isminetype *)0x0) {
      piVar2 = _GLOBAL__N_1::std::optional<wallet::isminetype>::operator*
                         ((optional<wallet::isminetype> *)in_stack_ffffffffffffff18);
      *in_RCX = *piVar2;
    }
    if (in_R8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      this_00 = (optional<wallet::AddressPurpose> *)((__str->_M_dataplus)._M_p + 0x28);
      _GLOBAL__N_1::std::optional<wallet::isminetype>::operator*
                ((optional<wallet::isminetype> *)in_stack_ffffffffffffff18);
      AVar1 = _GLOBAL__N_1::std::optional<wallet::AddressPurpose>::value_or<wallet::AddressPurpose>
                        (this_00,(AddressPurpose *)
                                 CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
      *(AddressPurpose *)&(in_R8->_M_dataplus)._M_p = AVar1;
    }
    local_59 = true;
  }
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffff18);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_59;
  }
  __stack_chk_fail();
}

Assistant:

bool getAddress(const CTxDestination& dest,
        std::string* name,
        isminetype* is_mine,
        AddressPurpose* purpose) override
    {
        LOCK(m_wallet->cs_wallet);
        const auto& entry = m_wallet->FindAddressBookEntry(dest, /*allow_change=*/false);
        if (!entry) return false; // addr not found
        if (name) {
            *name = entry->GetLabel();
        }
        std::optional<isminetype> dest_is_mine;
        if (is_mine || purpose) {
            dest_is_mine = m_wallet->IsMine(dest);
        }
        if (is_mine) {
            *is_mine = *dest_is_mine;
        }
        if (purpose) {
            // In very old wallets, address purpose may not be recorded so we derive it from IsMine
            *purpose = entry->purpose.value_or(*dest_is_mine ? AddressPurpose::RECEIVE : AddressPurpose::SEND);
        }
        return true;
    }